

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TlsReceiverTest::TlsReceiverTest(TlsReceiverTest *this)

{
  AsyncIoProvider *pAVar1;
  undefined1 auStack_158 [24];
  undefined1 local_140 [16];
  MockConnectionReceiver *local_130;
  Options local_128;
  Options local_a0;
  
  TlsTest::defaultClient();
  TlsTest::defaultServer();
  TlsTest::TlsTest(&this->super_TlsTest,&local_a0,&local_128);
  kj::_::NullableValue<kj::Function<void_(kj::Exception_&&)>_>::~NullableValue
            (&local_128.acceptErrorHandler.ptr);
  kj::_::NullableValue<kj::Function<void_(kj::Exception_&&)>_>::~NullableValue
            (&local_a0.acceptErrorHandler.ptr);
  (this->receiver).disposer = (Disposer *)0x0;
  (this->receiver).ptr = (ConnectionReceiver *)0x0;
  pAVar1 = (this->super_TlsTest).io.provider.ptr;
  local_130 = (MockConnectionReceiver *)operator_new(0x40);
  (local_130->super_ConnectionReceiver)._vptr_ConnectionReceiver =
       (_func_int **)&PTR_accept_0058fde0;
  local_130->provider = pAVar1;
  (local_130->serverFulfiller).disposer = (Disposer *)0x0;
  (local_130->serverFulfiller).ptr = (PromiseFulfiller<void> *)0x0;
  (local_130->clientRequests).builder.ptr = (ClientRequest *)0x0;
  (local_130->clientRequests).builder.pos =
       (RemoveConst<kj::(anonymous_namespace)::MockConnectionReceiver::ClientRequest> *)0x0;
  (local_130->clientRequests).builder.endPtr = (ClientRequest *)0x0;
  (local_130->clientRequests).builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  auStack_158._16_8_ =
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::MockConnectionReceiver>::instance;
  this->baseReceiver = local_130;
  local_140._8_8_ =
       &kj::_::HeapDisposer<kj::(anonymous_namespace)::MockConnectionReceiver>::instance;
  local_140._0_8_ = 0;
  TlsContext::wrapPort
            ((TlsContext *)auStack_158,
             (Own<kj::ConnectionReceiver,_std::nullptr_t> *)&(this->super_TlsTest).tlsServer);
  Own<kj::ConnectionReceiver,_std::nullptr_t>::operator=
            (&this->receiver,(Own<kj::ConnectionReceiver,_std::nullptr_t> *)auStack_158);
  Own<kj::ConnectionReceiver,_std::nullptr_t>::dispose
            ((Own<kj::ConnectionReceiver,_std::nullptr_t> *)auStack_158);
  Own<kj::ConnectionReceiver,_std::nullptr_t>::dispose
            ((Own<kj::ConnectionReceiver,_std::nullptr_t> *)(local_140 + 8));
  Own<kj::(anonymous_namespace)::MockConnectionReceiver,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::MockConnectionReceiver,_std::nullptr_t> *)
             (auStack_158 + 0x10));
  return;
}

Assistant:

TlsReceiverTest(): TlsTest() {
    auto baseReceiverPtr = kj::heap<MockConnectionReceiver>(*io.provider);
    baseReceiver = baseReceiverPtr.get();
    receiver = tlsServer.wrapPort(kj::mv(baseReceiverPtr));
  }